

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

mod2entry * mod2sparse_insert(mod2sparse *m,int row,int col)

{
  int iVar1;
  uint uVar2;
  mod2block *pmVar3;
  mod2entry *pmVar4;
  mod2entry *pmVar5;
  mod2entry *pmVar6;
  long lVar7;
  char *__ptr;
  bool bVar8;
  size_t sStack_30;
  
  if ((((row < 0) || (col < 0)) || (m->n_rows <= row)) || (m->n_cols <= col)) {
    __ptr = "mod2sparse_insert: row or column index out of bounds\n";
    sStack_30 = 0x35;
    goto LAB_00124e58;
  }
  pmVar5 = m->rows[(uint)row].left;
  if (pmVar5->row < 0) {
LAB_00124d0c:
    pmVar5 = pmVar5->right;
  }
  else {
    if (pmVar5->col == col) {
      return pmVar5;
    }
    if (pmVar5->col < col) goto LAB_00124d0c;
    pmVar5 = m->rows + (uint)row;
    do {
      pmVar5 = pmVar5->right;
      if (pmVar5->row < 0) break;
      if (pmVar5->col == col) {
        return pmVar5;
      }
    } while (pmVar5->col <= col);
  }
  pmVar4 = m->next_free;
  if (pmVar4 == (mod2entry *)0x0) {
    pmVar3 = (mod2block *)chk_alloc(1,0x238);
    pmVar3->next = m->blocks;
    m->blocks = pmVar3;
    lVar7 = 10;
    pmVar4 = m->next_free;
    pmVar6 = pmVar3->entry;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      pmVar6->left = pmVar4;
      pmVar4 = pmVar6;
      pmVar6 = pmVar6 + 1;
    }
  }
  m->next_free = pmVar4->left;
  pmVar4->pr = 0.0;
  pmVar4->lr = 0.0;
  pmVar4->row = row;
  pmVar4->col = col;
  pmVar6 = pmVar5->left;
  pmVar4->left = pmVar6;
  pmVar4->right = pmVar5;
  pmVar6->right = pmVar4;
  pmVar4->right->left = pmVar4;
  pmVar5 = m->cols[(uint)col].up;
  iVar1 = pmVar5->row;
  if (iVar1 != row || iVar1 < 0) {
    if (iVar1 < row) {
      pmVar5 = pmVar5->down;
    }
    else {
      pmVar5 = m->cols + (uint)col;
      do {
        pmVar5 = pmVar5->down;
        uVar2 = pmVar5->row;
        if (uVar2 == row && -1 < (int)uVar2) goto LAB_00124e30;
      } while (uVar2 <= (uint)row);
    }
    pmVar6 = pmVar5->up;
    pmVar4->up = pmVar6;
    pmVar4->down = pmVar5;
    pmVar6->down = pmVar4;
    pmVar4->down->up = pmVar4;
    return pmVar4;
  }
LAB_00124e30:
  __ptr = "mod2sparse_insert: Garbled matrix\n";
  sStack_30 = 0x22;
LAB_00124e58:
  fwrite(__ptr,sStack_30,1,_stderr);
  exit(1);
}

Assistant:

mod2entry *mod2sparse_insert
( mod2sparse *m,
  int row,
  int col
)
{
  mod2entry *re, *ce, *ne;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_insert: row or column index out of bounds\n");
    exit(1);
  }

  /* Find old entry and return it, or allocate new entry and insert into row. */

  re = mod2sparse_last_in_row(m,row);

  if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
  { return re;
  }

  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { re = re->right;
  }
  else
  {
    re = mod2sparse_first_in_row(m,row);

    for (;;)
    { 
      if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
      { return re;
      }

      if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
      { break;
      } 

      re = mod2sparse_next_in_row(re);
    }
  }

  ne = alloc_entry(m);

  ne->row = row;
  ne->col = col;

  ne->left = re->left;
  ne->right = re;
  ne->left->right = ne;
  ne->right->left = ne;

  /* Insert new entry into column.  If we find an existing entry here,
     the matrix must be garbled, since we didn't find it in the row. */

  ce = mod2sparse_last_in_col(m,col);

  if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
  { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
    exit(1);
  }

  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row) 
  { ce = ce->down;
  }
  else
  {
    ce = mod2sparse_first_in_col(m,col);

    for (;;)
    { 
      if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
      { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
        exit(1);
      }

      if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
      { break;
      } 

      ce = mod2sparse_next_in_col(ce);
    }
  }
    
  ne->up = ce->up;
  ne->down = ce;
  ne->up->down = ne;
  ne->down->up = ne;

  /* Return the new entry. */

  return ne;
}